

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BloomFilter.h
# Opt level: O2

bool __thiscall BloomFilter<long_long>::find(BloomFilter<long_long> *this,longlong *data)

{
  pointer p_Var1;
  unsigned_long uVar2;
  _Bind<unsigned_long_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_void_*,_int,_unsigned_int)>
  *_hash;
  pointer p_Var3;
  bool bVar4;
  reference rVar5;
  
  p_Var1 = (this->_hashes).
           super__Vector_base<std::_Bind<unsigned_long_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_void_*,_int,_unsigned_int)>,_std::allocator<std::_Bind<unsigned_long_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_void_*,_int,_unsigned_int)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar4 = true;
  for (p_Var3 = (this->_hashes).
                super__Vector_base<std::_Bind<unsigned_long_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_void_*,_int,_unsigned_int)>,_std::allocator<std::_Bind<unsigned_long_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_void_*,_int,_unsigned_int)>_>_>
                ._M_impl.super__Vector_impl_data._M_start; p_Var3 != p_Var1; p_Var3 = p_Var3 + 1) {
    uVar2 = (*p_Var3->_M_f)(data,4,(p_Var3->_M_bound_args).
                                   super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::_Placeholder<2>,_int>
                                   .super__Tuple_impl<1UL,_std::_Placeholder<2>,_int>.
                                   super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>.
                                   _M_head_impl);
    if (bVar4) {
      rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        (&this->_bits,uVar2 % this->_length);
      bVar4 = (*rVar5._M_p & rVar5._M_mask) != 0;
    }
    else {
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

auto BloomFilter<T>::find(const T &data) {
    auto result = true;
    for (auto &_hash : _hashes) {
        auto h = _hash(&data, 4) % _length;
        result = result && _bits[h];
    }
    return result;
}